

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeForwardPointer(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  StorageClass SVar3;
  StorageClass SVar4;
  DiagnosticStream *pDVar5;
  spv_const_context psVar6;
  string local_7c8;
  DiagnosticStream local_7a8;
  DiagnosticStream local_5d0;
  Instruction *local_3f8;
  Instruction *pointee_type;
  undefined1 local_3e8 [4];
  uint pointee_type_id;
  StorageClass local_20c;
  undefined1 local_208 [4];
  StorageClass storage_class;
  Instruction *local_30;
  Instruction *pointer_type_inst;
  Instruction *pIStack_20;
  uint pointer_type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  pointer_type_inst._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,pointer_type_inst._4_4_);
  OVar2 = Instruction::opcode(local_30);
  if (OVar2 == OpTypePointer) {
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(pIStack_20,1);
    local_20c = SVar3;
    SVar4 = Instruction::GetOperandAs<spv::StorageClass>(local_30,1);
    if (SVar3 == SVar4) {
      pointee_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_30,2);
      local_3f8 = ValidationState_t::FindDef((ValidationState_t *)inst_local,pointee_type._4_4_);
      if ((local_3f8 == (Instruction *)0x0) ||
         (OVar2 = Instruction::opcode(local_3f8), OVar2 != OpTypeStruct)) {
        ValidationState_t::diag
                  (&local_5d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_5d0,(char (*) [43])"Forward pointers must point to a structure");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_5d0);
      }
      else {
        psVar6 = ValidationState_t::context((ValidationState_t *)inst_local);
        bVar1 = spvIsVulkanEnv(psVar6->target_env);
        if ((bVar1) && (local_20c != PhysicalStorageBuffer)) {
          ValidationState_t::diag
                    (&local_7a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
          ValidationState_t::VkErrorID_abi_cxx11_
                    (&local_7c8,(ValidationState_t *)inst_local,0x1267,(char *)0x0);
          pDVar5 = DiagnosticStream::operator<<(&local_7a8,&local_7c8);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [43])"In Vulkan, OpTypeForwardPointer must have ");
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [42])"a storage class of PhysicalStorageBuffer.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          std::__cxx11::string::~string((string *)&local_7c8);
          DiagnosticStream::~DiagnosticStream(&local_7a8);
        }
        else {
          __local._4_4_ = SPV_SUCCESS;
        }
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 pIStack_20);
      pDVar5 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3e8,
                          (char (*) [58])"Storage class in OpTypeForwardPointer does not match the "
                         );
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [20])"pointer definition.");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e8);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_208,
                        (char (*) [60])"Pointer type in OpTypeForwardPointer is not a pointer type."
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeForwardPointer(ValidationState_t& _,
                                        const Instruction* inst) {
  const auto pointer_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto pointer_type_inst = _.FindDef(pointer_type_id);
  if (pointer_type_inst->opcode() != spv::Op::OpTypePointer) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Pointer type in OpTypeForwardPointer is not a pointer type.";
  }

  const auto storage_class = inst->GetOperandAs<spv::StorageClass>(1);
  if (storage_class != pointer_type_inst->GetOperandAs<spv::StorageClass>(1)) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Storage class in OpTypeForwardPointer does not match the "
           << "pointer definition.";
  }

  const auto pointee_type_id = pointer_type_inst->GetOperandAs<uint32_t>(2);
  const auto pointee_type = _.FindDef(pointee_type_id);
  if (!pointee_type || pointee_type->opcode() != spv::Op::OpTypeStruct) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Forward pointers must point to a structure";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (storage_class != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4711)
             << "In Vulkan, OpTypeForwardPointer must have "
             << "a storage class of PhysicalStorageBuffer.";
    }
  }

  return SPV_SUCCESS;
}